

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O2

void __thiscall Scalar::setParameter(Scalar *this,string *name,string *value)

{
  bool bVar1;
  stringstream parameter;
  stringstream local_1a0 [16];
  ostream local_190;
  
  bVar1 = std::operator==(name,"value");
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(&local_190,(string *)value);
    std::istream::_M_extract<double>((double *)local_1a0);
    std::__cxx11::stringstream::~stringstream(local_1a0);
    return;
  }
  Parametric::setParameter((Parametric *)this,name,value);
  return;
}

Assistant:

void Scalar::setParameter(const string& name, const string& value)
{
	if (name=="value") {
		stringstream parameter;
		parameter << value;
		parameter >> scalarValue;
	} else
		StochasticFunction::setParameter(name, value);
}